

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O1

void __thiscall
wabt::anon_unknown_1::WatWriter::PushExpr
          (WatWriter *this,Expr *expr,Index operand_count,Index result_count)

{
  undefined8 *puVar1;
  pointer pEVar2;
  ulong uVar3;
  Expr *pEVar4;
  Expr *pEVar5;
  pointer pEVar6;
  pointer pEVar7;
  pointer pEVar8;
  undefined4 in_register_0000000c;
  ulong uVar9;
  pointer __alloc;
  pointer pEVar10;
  undefined4 in_register_00000014;
  ExprTree *__args;
  Expr *pEVar11;
  ExprTree *extraout_RDX;
  ExprTree *extraout_RDX_00;
  ExprTree *__args_00;
  ulong uVar12;
  long lVar13;
  Expr *__last;
  vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
  *this_00;
  long lVar14;
  pointer *ppEVar15;
  pointer pEVar16;
  vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
  local_98;
  pointer local_80;
  Index local_78;
  Index local_74;
  pointer local_70;
  WatWriter *local_68;
  ExprTree local_60;
  pointer local_40;
  Expr *local_38;
  
  __args = (ExprTree *)CONCAT44(in_register_00000014,operand_count);
  __alloc = (pointer)CONCAT44(in_register_0000000c,result_count);
  uVar12 = (ulong)operand_count;
  this_00 = &this->expr_tree_stack_;
  pEVar8 = (this->expr_tree_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((ulong)((long)pEVar8 -
              (long)(this->expr_tree_stack_).
                    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) < uVar12) {
    if (pEVar8 == (this->expr_tree_stack_).
                  super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      pEVar4 = expr;
      local_38 = (Expr *)std::
                         vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                         ::_M_check_len(this_00,(size_type)expr,(char *)__args);
      pEVar2 = (this->expr_tree_stack_).
               super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_40 = (this->expr_tree_stack_).
                 super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      lVar13 = (long)pEVar8 - (long)pEVar2;
      local_68 = this;
      pEVar6 = std::
               _Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
               ::_M_allocate((_Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                              *)local_38,(size_t)pEVar4);
      *(Expr **)((long)pEVar6 + lVar13) = expr;
      puVar1 = (undefined8 *)((long)pEVar6 + lVar13 + 8);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)pEVar6 + lVar13 + 0x18) = 0;
      pEVar7 = std::
               vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
               ::_S_relocate(pEVar2,pEVar8,pEVar6,(_Tp_alloc_type *)__alloc);
      pEVar8 = std::
               vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
               ::_S_relocate(pEVar8,local_40,pEVar7 + 1,(_Tp_alloc_type *)__alloc);
      if (pEVar2 != (pointer)0x0) {
        operator_delete(pEVar2);
      }
      (local_68->expr_tree_stack_).
      super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
      ._M_impl.super__Vector_impl_data._M_start = pEVar6;
      (local_68->expr_tree_stack_).
      super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
      ._M_impl.super__Vector_impl_data._M_finish = pEVar8;
      (local_68->expr_tree_stack_).
      super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pEVar6 + (long)local_38;
      this = local_68;
    }
    else {
      pEVar8->expr = expr;
      (pEVar8->children).
      super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pEVar8->children).
      super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pEVar8->children).
      super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ppEVar15 = &(this->expr_tree_stack_).
                  super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *ppEVar15 = *ppEVar15 + 1;
    }
    FlushExprTreeStack(this);
    return;
  }
  local_80 = pEVar8 + -uVar12;
  local_60.children.
  super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_60.children.
  super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60.children.
  super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78 = result_count;
  local_70 = pEVar8;
  local_60.expr = expr;
  if (operand_count != 0) {
    pEVar4 = (Expr *)0x0;
    __last = (Expr *)0x0;
    pEVar11 = (Expr *)0x0;
    lVar13 = uVar12 + 1;
    ppEVar15 = &(local_80->children).
                super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_74 = operand_count;
    local_68 = this;
    do {
      if (__last == pEVar11) {
        lVar14 = (long)__last - (long)pEVar4;
        if (lVar14 == 0x7fffffffffffffe0) {
          local_60.children.
          super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)pEVar4;
          local_60.children.
          super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)__last;
          local_60.children.
          super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pEVar11;
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar3 = lVar14 >> 5;
        uVar9 = 1;
        if (__last != pEVar4) {
          uVar9 = uVar3;
        }
        pEVar8 = (pointer)(uVar9 + uVar3);
        if ((pointer)0x3fffffffffffffe < pEVar8) {
          pEVar8 = (pointer)0x3ffffffffffffff;
        }
        __alloc = (pointer)(uVar9 + uVar3);
        local_40 = (pointer)0x3ffffffffffffff;
        if (!CARRY8(uVar9,uVar3)) {
          local_40 = pEVar8;
        }
        local_38 = pEVar4;
        pEVar4 = (Expr *)std::
                         _Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                         ::_M_allocate((_Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                                        *)local_40,(size_t)local_40);
        pEVar11 = local_38;
        *(pointer *)((long)pEVar4 + lVar14) = ppEVar15[-3];
        *(pointer *)((long)pEVar4 + lVar14 + 8) = ((_Vector_impl_data *)(ppEVar15 + -2))->_M_start;
        *(pointer *)((long)pEVar4 + lVar14 + 0x10) = ppEVar15[-1];
        *(pointer *)((long)pEVar4 + lVar14 + 0x18) = *ppEVar15;
        ((_Vector_impl_data *)(ppEVar15 + -2))->_M_start = (pointer)0x0;
        ppEVar15[-1] = (pointer)0x0;
        *ppEVar15 = (pointer)0x0;
        pEVar5 = (Expr *)std::
                         vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                         ::_S_relocate((pointer)local_38,(pointer)__last,(pointer)pEVar4,
                                       (_Tp_alloc_type *)__alloc);
        if (pEVar11 != (Expr *)0x0) {
          operator_delete(pEVar11);
        }
        pEVar11 = (Expr *)(&pEVar4->_vptr_Expr + (long)local_40 * 4);
        expr = __last;
      }
      else {
        __last->_vptr_Expr = (_func_int **)ppEVar15[-3];
        (__last->super_intrusive_list_base<wabt::Expr>).next_ =
             (Expr *)((_Vector_impl_data *)(ppEVar15 + -2))->_M_start;
        (__last->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)ppEVar15[-1];
        (__last->loc).filename.data_ = (char *)*ppEVar15;
        ((_Vector_impl_data *)(ppEVar15 + -2))->_M_start = (pointer)0x0;
        ppEVar15[-1] = (pointer)0x0;
        *ppEVar15 = (pointer)0x0;
        pEVar5 = __last;
      }
      __last = (Expr *)&(pEVar5->loc).filename.size_;
      lVar13 = lVar13 + -1;
      ppEVar15 = ppEVar15 + 4;
    } while (1 < lVar13);
    __args = (ExprTree *)(ulong)local_74;
    this = local_68;
    local_60.children.
    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pEVar4;
    local_60.children.
    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)__last;
    local_60.children.
    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pEVar11;
  }
  if ((int)__args != 0) {
    lVar13 = (long)(this->expr_tree_stack_).
                   super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)local_70;
    if ((lVar13 != 0) && (lVar13 = lVar13 >> 5, 0 < lVar13)) {
      lVar13 = lVar13 + 1;
      ppEVar15 = &(local_70->children).
                  super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      do {
        ppEVar15[uVar12 * -4 + -3] = ppEVar15[-3];
        local_98.
        super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
        ._M_impl.super__Vector_impl_data._M_start = ppEVar15[uVar12 * -4 + -2];
        local_98.
        super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppEVar15[uVar12 * -4 + -1];
        local_98.
        super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = ppEVar15[uVar12 * -4];
        ppEVar15[uVar12 * -4 + -2] = ((_Vector_impl_data *)(ppEVar15 + -2))->_M_start;
        ppEVar15[uVar12 * -4 + -1] = ppEVar15[-1];
        ppEVar15[uVar12 * -4] = *ppEVar15;
        ((_Vector_impl_data *)(ppEVar15 + -2))->_M_start =
             local_98.
             super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
             ._M_impl.super__Vector_impl_data._M_start;
        ppEVar15[-1] = local_98.
                       super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
        *ppEVar15 = local_98.
                    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
        expr = (Expr *)0x0;
        ((_Vector_impl_data *)(ppEVar15 + -2))->_M_start = (pointer)0x0;
        ppEVar15[-1] = (pointer)0x0;
        *ppEVar15 = (pointer)0x0;
        std::
        vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
        ::~vector(&local_98);
        lVar13 = lVar13 + -1;
        ppEVar15 = ppEVar15 + 4;
        __args = extraout_RDX;
      } while (1 < lVar13);
    }
    pEVar6 = (this->expr_tree_stack_).
             super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pEVar10 = (pointer)((long)local_80 + ((long)pEVar6 - (long)local_70));
    __alloc = pEVar10;
    pEVar16 = pEVar10;
    if (pEVar6 != pEVar10) {
      do {
        std::
        vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
        ::~vector(&pEVar16->children);
        pEVar16 = pEVar16 + 1;
      } while (pEVar16 != pEVar6);
      (this->expr_tree_stack_).
      super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
      ._M_impl.super__Vector_impl_data._M_finish = pEVar10;
      __args = extraout_RDX_00;
    }
  }
  pEVar8 = (this->expr_tree_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pEVar8 == (this->expr_tree_stack_).
                super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    pEVar7 = (pointer)std::
                      vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                      ::_M_check_len(this_00,(size_type)expr,(char *)__args);
    pEVar2 = (this->expr_tree_stack_).
             super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_38 = (Expr *)(this->expr_tree_stack_).
                       super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
    pEVar6 = std::
             _Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
             ::_M_allocate((_Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                            *)pEVar7,(size_t)expr);
    local_40 = pEVar7;
    std::allocator_traits<std::allocator<wabt::(anonymous_namespace)::ExprTree>>::
    construct<wabt::(anonymous_namespace)::ExprTree,wabt::(anonymous_namespace)::ExprTree&>
              ((allocator_type *)(((long)pEVar8 - (long)pEVar2) + (long)pEVar6),&local_60,__args_00)
    ;
    pEVar7 = std::
             vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
             ::_S_relocate(pEVar2,pEVar8,pEVar6,(_Tp_alloc_type *)__alloc);
    pEVar8 = std::
             vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
             ::_S_relocate(pEVar8,(pointer)local_38,pEVar7 + 1,(_Tp_alloc_type *)__alloc);
    if (pEVar2 != (pointer)0x0) {
      operator_delete(pEVar2);
    }
    (this->expr_tree_stack_).
    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
    ._M_impl.super__Vector_impl_data._M_start = pEVar6;
    (this->expr_tree_stack_).
    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
    ._M_impl.super__Vector_impl_data._M_finish = pEVar8;
    (this->expr_tree_stack_).
    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pEVar6 + (long)local_40;
  }
  else {
    std::allocator_traits<std::allocator<wabt::(anonymous_namespace)::ExprTree>>::
    construct<wabt::(anonymous_namespace)::ExprTree,wabt::(anonymous_namespace)::ExprTree&>
              ((allocator_type *)pEVar8,&local_60,__args);
    ppEVar15 = &(this->expr_tree_stack_).
                super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *ppEVar15 = *ppEVar15 + 1;
  }
  if (local_78 == 0) {
    FlushExprTreeStack(this);
  }
  std::
  vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
  ::~vector(&local_60.children);
  return;
}

Assistant:

void WatWriter::PushExpr(const Expr* expr,
                         Index operand_count,
                         Index result_count) {
  WABT_TRACE_ARGS(PushExpr, "%s, %" PRIindex ", %" PRIindex "",
                  GetExprTypeName(*expr), operand_count, result_count);
  if (operand_count <= expr_tree_stack_.size()) {
    auto last_operand = expr_tree_stack_.end();
    auto first_operand = last_operand - operand_count;
    ExprTree tree(expr);
    std::move(first_operand, last_operand, std::back_inserter(tree.children));
    expr_tree_stack_.erase(first_operand, last_operand);
    expr_tree_stack_.emplace_back(tree);
    if (result_count == 0) {
      FlushExprTreeStack();
    }
  } else {
    expr_tree_stack_.emplace_back(expr);
    FlushExprTreeStack();
  }
}